

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# movDemuxer.cpp
# Opt level: O2

int __thiscall MovParsedH264TrackData::getNalSize(MovParsedH264TrackData *this,uint8_t *buff)

{
  uint uVar1;
  ostream *poVar2;
  undefined4 *puVar3;
  uint *local_1a8;
  undefined8 local_1a0;
  uint local_198;
  undefined4 uStack_194;
  undefined4 uStack_190;
  undefined4 uStack_18c;
  ostringstream ss;
  
  switch(this->nal_length_size) {
  case '\x01':
    uVar1 = (uint)*buff;
    break;
  case '\x02':
    uVar1 = (uint)(ushort)(*(ushort *)buff << 8 | *(ushort *)buff >> 8);
    break;
  case '\x03':
    uVar1 = (uint)buff[2] | (uint)buff[1] << 8 | (uint)*buff << 0x10;
    break;
  case '\x04':
    uVar1 = *(uint *)buff;
    uVar1 = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    break;
  default:
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
    poVar2 = std::operator<<((ostream *)&ss,
                             "MP4/MOV error: Unsupported H.264/AVC frame length field value ");
    std::operator<<(poVar2,this->nal_length_size);
    puVar3 = (undefined4 *)__cxa_allocate_exception(0x28);
    std::__cxx11::stringbuf::str();
    *puVar3 = 0x3b6;
    *(undefined4 **)(puVar3 + 2) = puVar3 + 6;
    if (local_1a8 == &local_198) {
      puVar3[6] = local_198;
      puVar3[7] = uStack_194;
      puVar3[8] = uStack_190;
      puVar3[9] = uStack_18c;
    }
    else {
      *(uint **)(puVar3 + 2) = local_1a8;
      *(ulong *)(puVar3 + 6) = CONCAT44(uStack_194,local_198);
    }
    *(undefined8 *)(puVar3 + 4) = local_1a0;
    local_198 = local_198 & 0xffffff00;
    __cxa_throw(puVar3,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
  }
  return uVar1;
}

Assistant:

int getNalSize(const uint8_t* buff) const
    {
        if (nal_length_size == 1)
            return buff[0];
        if (nal_length_size == 2)
            return (buff[0] << 8) + buff[1];
        if (nal_length_size == 3)
            return (buff[0] << 16) + (buff[1] << 8) + buff[2];
        if (nal_length_size == 4)
            return (buff[0] << 24) + (buff[1] << 16) + (buff[2] << 8) + buff[3];

        THROW(ERR_MOV_PARSE, "MP4/MOV error: Unsupported H.264/AVC frame length field value " << nal_length_size)
    }